

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisIrregular.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::GridAxisIrregular::GridAxisIrregular
          (GridAxisIrregular *this,KFLOAT64 InitialXi,KFLOAT64 FinalXi,KUINT16 PointsXi,
          KUINT8 InterleafFactor,KUINT8 AxisType,KDataStream *stream)

{
  iterator iVar1;
  ushort uVar2;
  byte bVar3;
  ushort uVar4;
  KUINT16 ui16TmpVal;
  unsigned_short local_3a;
  vector<unsigned_short,std::allocator<unsigned_short>> *local_38;
  
  GridAxisRegular::GridAxisRegular
            (&this->super_GridAxisRegular,InitialXi,FinalXi,PointsXi,InterleafFactor,AxisType,stream
            );
  (this->super_GridAxisRegular).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GridAxisIrregular_0022ac50;
  local_38 = (vector<unsigned_short,std::allocator<unsigned_short>> *)&this->m_vXiValues;
  (this->m_vXiValues).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vXiValues).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vXiValues).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vui16Padding).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vui16Padding).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vui16Padding).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  KDataStream::Read<double>(stream,(double *)&this->m_f64CoordScaleXi);
  KDataStream::Read<double>(stream,(double *)&this->m_f64CoordOffsetXi);
  local_3a = 0;
  uVar2 = (this->super_GridAxisRegular).m_ui16NumPoints;
  if (uVar2 != 0) {
    uVar4 = 0;
    do {
      KDataStream::Read<unsigned_short>(stream,&local_3a);
      iVar1._M_current =
           (this->m_vXiValues).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->m_vXiValues).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_short,std::allocator<unsigned_short>>::
        _M_realloc_insert<unsigned_short_const&>(local_38,iVar1,&local_3a);
      }
      else {
        *iVar1._M_current = local_3a;
        (this->m_vXiValues).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      uVar4 = uVar4 + 1;
      uVar2 = (this->super_GridAxisRegular).m_ui16NumPoints;
    } while (uVar4 < uVar2);
  }
  if ((uVar2 & 3) != 0) {
    bVar3 = 0;
    do {
      KDataStream::Read<unsigned_short>(stream,&local_3a);
      iVar1._M_current =
           (this->m_vui16Padding).
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->m_vui16Padding).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_short,std::allocator<unsigned_short>>::
        _M_realloc_insert<unsigned_short_const&>
                  ((vector<unsigned_short,std::allocator<unsigned_short>> *)&this->m_vui16Padding,
                   iVar1,&local_3a);
      }
      else {
        *iVar1._M_current = local_3a;
        (this->m_vui16Padding).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      bVar3 = bVar3 + 1;
    } while (bVar3 < (byte)(uVar2 & 3));
  }
  return;
}

Assistant:

GridAxisIrregular::GridAxisIrregular( KFLOAT64 InitialXi, KFLOAT64 FinalXi, KUINT16 PointsXi, KUINT8 InterleafFactor,
                                      KUINT8 AxisType, KDataStream & stream ) :
    GridAxisRegular( InitialXi, FinalXi, PointsXi, InterleafFactor, AxisType, stream )
{
    stream >> m_f64CoordScaleXi
           >> m_f64CoordOffsetXi;

    KUINT16 ui16TmpVal = 0;
    for( KUINT16 i = 0; i < m_ui16NumPoints; ++i )
    {
        stream >> ui16TmpVal;
        m_vXiValues.push_back( ui16TmpVal );
    }

    // Calculate the padding that needs to be extracted. 64 bit boundary
    KUINT8 NumPadding = m_ui16NumPoints % 4;
    for( KUINT8 i = 0; i < NumPadding; ++i )
    {
        stream >> ui16TmpVal;
        m_vui16Padding.push_back( ui16TmpVal );
    }
}